

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot_playground.cpp
# Opt level: O1

void __thiscall transition::fix_names(transition *this)

{
  long lVar1;
  string *this_00;
  long *local_30 [2];
  long local_20 [2];
  
  fix_name(this,&this->state_from);
  fix_name(this,&this->state_to);
  this_00 = &this->label;
  lVar1 = std::__cxx11::string::rfind((char)this_00,0x3a);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)this_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_30);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return;
}

Assistant:

void fix_names()
    {
        fix_name(state_from);
        fix_name(state_to);
        const size_t pos = label.rfind(':');
        if (pos != std::string::npos) {
            label = label.substr(pos+1);
        }
    }